

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_build_name_lists(anm_archive_t *anm)

{
  anm_entry_t *local_50;
  anm_entry_t *local_48;
  undefined8 *local_40;
  list_node_t *node_1;
  list_node_t *node;
  anm_entry_t **nextloc;
  anm_entry_t *tmp;
  anm_entry_t *entry;
  char *name;
  anm_archive_t *anm_local;
  
  node_1 = (anm->names).head;
  name = (char *)anm;
  while( true ) {
    if (node_1 == (list_node_t *)0x0) {
      local_48 = (anm_entry_t *)0x0;
    }
    else {
      local_48 = (anm_entry_t *)node_1->data;
    }
    entry = local_48;
    if (node_1 == (list_node_t *)0x0) break;
    node = (list_node_t *)&nextloc;
    local_40 = *(undefined8 **)(name + 0x20);
    while( true ) {
      if (local_40 == (undefined8 *)0x0) {
        local_50 = (anm_entry_t *)0x0;
      }
      else {
        local_50 = (anm_entry_t *)local_40[2];
      }
      tmp = local_50;
      if (local_40 == (undefined8 *)0x0) break;
      if ((anm_entry_t *)local_50->name == entry) {
        node->next = (list_node_t *)local_50;
        node = (list_node_t *)&tmp->next_by_name;
      }
      local_40 = (undefined8 *)*local_40;
    }
    node_1 = node_1->next;
  }
  return;
}

Assistant:

static void
anm_build_name_lists(
    const anm_archive_t *anm)
{
    const char *name;
    anm_entry_t *entry, *tmp, **nextloc;
    list_for_each(&anm->names, name) {
        nextloc = &tmp;
        list_for_each(&anm->entries, entry)
            if (entry->name == name) {
                *nextloc = entry;
                nextloc = &entry->next_by_name;
            }
    }
}